

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void setup_var_ref(gen_ctx_t gen_ctx,MIR_reg_t var,MIR_insn_t insn,size_t nop,size_t insn_num,
                  int def_p)

{
  undefined8 *puVar1;
  anon_union_32_12_57d33f68_for_u *paVar2;
  undefined1 auVar3 [32];
  anon_union_32_12_57d33f68_for_u aVar4;
  char cVar5;
  MIR_reg_t MVar6;
  uint uVar7;
  VARR_var_ref_t *pVVar8;
  VARR_size_t *pVVar9;
  combine_ctx *pcVar10;
  VARR_var_ref_t *pVVar11;
  VARR_MIR_op_t *pVVar12;
  bitmap_t pVVar13;
  MIR_op_t *pMVar14;
  MIR_insn_t pMVar15;
  long lVar16;
  bool bVar17;
  void *pvVar18;
  undefined8 uVar19;
  int64_t iVar20;
  char *pcVar21;
  char *pcVar22;
  undefined8 uVar23;
  MIR_disp_t MVar24;
  int iVar25;
  ulong uVar26;
  size_t *psVar27;
  var_ref_t *pvVar28;
  MIR_op_t *pMVar29;
  MIR_insn_t pMVar30;
  VARR_MIR_reg_t *pVVar31;
  int *piVar32;
  long *extraout_RDX;
  long extraout_RDX_00;
  ulong uVar33;
  MIR_reg_t *pMVar34;
  undefined4 in_register_00000034;
  MIR_insn_t_conflict pMVar35;
  MIR_insn_t_conflict __size;
  gen_ctx_t gen_ctx_00;
  gen_ctx_t pgVar36;
  long lVar37;
  size_t sVar38;
  size_t unaff_R14;
  size_t sVar39;
  MIR_insn_t_conflict pMVar40;
  char cStack_118;
  int iStack_114;
  bb_insn_t_conflict pbStack_110;
  ulong uStack_108;
  undefined8 uStack_100;
  MIR_insn_t_conflict pMStack_f8;
  MIR_reg_t MStack_f0;
  MIR_reg_t MStack_ec;
  long *plStack_e8;
  MIR_op_t *pMStack_e0;
  ulong uStack_d8;
  gen_ctx_t pgStack_d0;
  MIR_reg_t *pMStack_c8;
  MIR_insn_t pMStack_c0;
  gen_ctx_t pgStack_b8;
  void *pvStack_b0;
  undefined8 uStack_a8;
  int64_t iStack_a0;
  char *pcStack_98;
  undefined8 uStack_90;
  MIR_disp_t MStack_88;
  VARR_var_ref_t *pVStack_78;
  MIR_insn_t pMStack_70;
  gen_ctx_t pgStack_68;
  size_t sStack_60;
  size_t sStack_58;
  code *pcStack_50;
  int local_3c;
  size_t local_38;
  
  pMVar35 = (MIR_insn_t_conflict)CONCAT44(in_register_00000034,var);
  if (var == 0xffffffff) {
    return;
  }
  pVVar8 = gen_ctx->combine_ctx->var_refs;
  if (pVVar8 == (VARR_var_ref_t *)0x0) {
LAB_00173140:
    pcStack_50 = (code *)0x173145;
    setup_var_ref_cold_6();
  }
  else {
    pVVar9 = gen_ctx->combine_ctx->var_ref_ages;
    if (pVVar9 != (VARR_size_t *)0x0) {
      uVar26 = pVVar8->els_num;
      if (uVar26 != pVVar9->els_num) goto LAB_0017314a;
      uVar33 = (ulong)var;
      local_3c = def_p;
      local_38 = insn_num;
      if (uVar33 < uVar26) {
LAB_001730e3:
        pcVar10 = gen_ctx->combine_ctx;
        pcVar10->var_ref_ages_addr[uVar33] = pcVar10->curr_bb_var_ref_age;
        pvVar28 = pcVar10->var_refs_addr;
        pvVar28[uVar33].insn = insn;
        pvVar28[uVar33].nop = nop;
        pvVar28[uVar33].insn_num = insn_num;
        pvVar28[uVar33].def_p = (char)def_p;
        pvVar28[uVar33].del_p = '\0';
        return;
      }
      do {
        pVVar9 = gen_ctx->combine_ctx->var_ref_ages;
        if (pVVar9->varr == (size_t *)0x0) {
LAB_00173130:
          pcStack_50 = (code *)0x173138;
          setup_var_ref_cold_4();
LAB_00173138:
          pcStack_50 = (code *)0x173140;
          setup_var_ref_cold_3();
          goto LAB_00173140;
        }
        uVar26 = pVVar9->els_num + 1;
        if (pVVar9->size < uVar26) {
          unaff_R14 = (uVar26 >> 1) + uVar26;
          pMVar35 = (MIR_insn_t_conflict)(unaff_R14 * 8);
          pcStack_50 = (code *)0x173027;
          psVar27 = (size_t *)realloc(pVVar9->varr,(size_t)pMVar35);
          pVVar9->varr = psVar27;
          pVVar9->size = unaff_R14;
        }
        sVar39 = pVVar9->els_num;
        pVVar9->els_num = sVar39 + 1;
        pVVar9->varr[sVar39] = 0;
        pVVar8 = gen_ctx->combine_ctx->var_refs;
        gen_ctx_00 = (gen_ctx_t)pVVar8->varr;
        if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_00173138;
        uVar26 = pVVar8->els_num + 1;
        if (pVVar8->size < uVar26) {
          unaff_R14 = (uVar26 >> 1) + uVar26;
          pMVar35 = (MIR_insn_t_conflict)(unaff_R14 * 0x20);
          pcStack_50 = (code *)0x173081;
          pvVar28 = (var_ref_t *)realloc(gen_ctx_00,(size_t)pMVar35);
          pVVar8->varr = pvVar28;
          pVVar8->size = unaff_R14;
        }
        sVar39 = pVVar8->els_num;
        pVVar8->els_num = sVar39 + 1;
        pvVar28 = pVVar8->varr + sVar39;
        pvVar28->insn = (MIR_insn_t)0x0;
        pvVar28->insn_num = 0;
        pvVar28->nop = 0;
        pvVar28->def_p = '\0';
        pvVar28->del_p = '\0';
        *(undefined6 *)&pvVar28->field_0x1a = 0;
        pcVar10 = gen_ctx->combine_ctx;
        pVVar11 = pcVar10->var_refs;
        if (pVVar11 == (VARR_var_ref_t *)0x0) {
          pcStack_50 = (code *)0x173130;
          setup_var_ref_cold_2();
          goto LAB_00173130;
        }
      } while (pVVar11->els_num <= uVar33);
      pcVar10->var_refs_addr = pVVar11->varr;
      if (pcVar10->var_ref_ages != (VARR_size_t *)0x0) {
        pcVar10->var_ref_ages_addr = pcVar10->var_ref_ages->varr;
        insn_num = local_38;
        def_p = local_3c;
        goto LAB_001730e3;
      }
      pcStack_50 = combine_substitute;
      setup_var_ref_cold_1();
      pbStack_110 = (bb_insn_t_conflict)pMVar35->data;
      pMVar40 = pbStack_110->insn;
      uStack_108 = *(ulong *)&pMVar40->field_0x18 >> 0x20;
      if (uStack_108 == 0) {
        return;
      }
      pVVar12 = gen_ctx_00->combine_ctx->last_right_ops;
      uStack_100 = pMVar40;
      pVStack_78 = pVVar8;
      pMStack_70 = insn;
      pgStack_68 = gen_ctx;
      sStack_60 = unaff_R14;
      sStack_58 = nop;
      pcStack_50 = (code *)uVar33;
      if ((pVVar12 == (VARR_MIR_op_t *)0x0) || (pVVar12->varr == (MIR_op_t *)0x0)) {
LAB_00173980:
        combine_substitute_cold_13();
        __size = pMVar35;
        pgVar36 = gen_ctx_00;
LAB_00173985:
        combine_substitute_cold_11();
LAB_0017398d:
        combine_substitute_cold_10();
      }
      else {
        pgStack_d0 = (gen_ctx_t)gen_ctx_00->ctx;
        pVVar12->els_num = 0;
        lVar16 = uStack_108 * 0x30;
        lVar37 = 0;
        __size = pMVar35;
        plStack_e8 = extraout_RDX;
        do {
          pVVar12 = gen_ctx_00->combine_ctx->last_right_ops;
          puVar1 = (undefined8 *)((long)&pMVar40->ops[0].data + lVar37);
          pvStack_b0 = (void *)*puVar1;
          uStack_a8 = puVar1[1];
          iStack_a0 = puVar1[2];
          pcStack_98 = (char *)puVar1[3];
          uStack_90 = *(undefined8 *)((long)&pMVar40->ops[0].u + lVar37 + 0x10);
          MStack_88 = *(undefined8 *)((long)&pMVar40->ops[0].u + lVar37 + 0x18);
          pgVar36 = (gen_ctx_t)pVVar12->varr;
          if (pgVar36 == (gen_ctx_t)0x0) {
            combine_substitute_cold_12();
            goto LAB_00173929;
          }
          uVar26 = pVVar12->els_num + 1;
          if (pVVar12->size < uVar26) {
            sVar39 = (uVar26 >> 1) + uVar26;
            __size = (MIR_insn_t_conflict)(sVar39 * 0x30);
            pMVar29 = (MIR_op_t *)realloc(pgVar36,(size_t)__size);
            pVVar12->varr = pMVar29;
            pVVar12->size = sVar39;
            pMVar40 = uStack_100;
          }
          sVar39 = pVVar12->els_num;
          pMVar29 = pVVar12->varr;
          pVVar12->els_num = sVar39 + 1;
          auVar3._8_8_ = uStack_a8;
          auVar3._0_8_ = pvStack_b0;
          auVar3._16_8_ = iStack_a0;
          auVar3._24_8_ = pcStack_98;
          aVar4.str.s = pcStack_98;
          aVar4.i = iStack_a0;
          aVar4._16_8_ = uStack_90;
          aVar4.mem.disp = MStack_88;
          pMVar29[sVar39].u = aVar4;
          *(undefined1 (*) [32])(pMVar29 + sVar39) = auVar3;
          lVar37 = lVar37 + 0x30;
        } while (lVar16 != lVar37);
        pcVar10 = gen_ctx_00->combine_ctx;
        pVVar31 = pcVar10->insn_vars;
        if ((pVVar31 == (VARR_MIR_reg_t *)0x0) || (pVVar31->varr == (MIR_reg_t *)0x0))
        goto LAB_00173985;
        pVVar31->els_num = 0;
        pVVar13 = pcVar10->vars_bitmap;
        pMStack_f8 = pMVar35;
        if ((pVVar13 == (bitmap_t)0x0) || (pVVar13->varr == (bitmap_el_t *)0x0)) goto LAB_0017398d;
        pVVar13->els_num = 0;
        sVar38 = uStack_108 + (uStack_108 == 0);
        pMVar34 = &pMVar40->ops[0].u.mem.index;
        sVar39 = 0;
        do {
          __size = pMVar40;
          pgVar36 = pgStack_d0;
          MIR_insn_op_mode((MIR_context_t)pgStack_d0,pMVar40,sVar39,&iStack_114);
          if ((iStack_114 == 0) && (cVar5 = (char)pMVar34[-7], cVar5 != '\v')) {
            if (cVar5 == '\v') {
              if (pMVar34[-1] != 0xffffffff) {
                pgVar36 = gen_ctx_00;
                combine_process_var(gen_ctx_00,pMVar34[-1],pbStack_110);
              }
              __size = (MIR_insn_t_conflict)(ulong)*pMVar34;
              if (*pMVar34 != 0xffffffff) goto LAB_0017336b;
            }
            else if (cVar5 == '\x02') {
              __size = (MIR_insn_t_conflict)(ulong)*(uint *)(pMVar34 + -5);
LAB_0017336b:
              pgVar36 = gen_ctx_00;
              combine_process_var(gen_ctx_00,(MIR_reg_t)__size,pbStack_110);
            }
          }
          sVar39 = sVar39 + 1;
          pMVar34 = pMVar34 + 0xc;
        } while (sVar38 != sVar39);
        if (((*(uint *)&pMVar40->field_0x18 & 0xfffffffc) != 0) ||
           (*(char *)&pMVar40[1].insn_link.prev != '\x02')) goto LAB_00173458;
        pVVar31 = gen_ctx_00->combine_ctx->insn_vars;
        if (pVVar31 != (VARR_MIR_reg_t *)0x0) {
          if (pVVar31->els_num == 0) {
LAB_00173458:
            pVVar31 = gen_ctx_00->combine_ctx->insn_vars;
            if (pVVar31 == (VARR_MIR_reg_t *)0x0) {
LAB_00173929:
              combine_substitute_cold_8();
LAB_00173931:
              combine_substitute_cold_7();
LAB_00173939:
              combine_substitute_cold_3();
LAB_00173941:
              __assert_fail("op_ref->mode != MIR_OP_VAR_MEM || (op_ref->u.var_mem.base != var && op_ref->u.var_mem.index != var)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x228a,"int combine_substitute(gen_ctx_t, bb_insn_t *, long *)");
            }
            pMVar29 = pMVar40->ops;
            uStack_108 = uStack_108 + (uStack_108 == 0);
            pMStack_c8 = &pMVar40->ops[0].u.mem.index;
            uVar26 = 0;
            pgVar36 = gen_ctx_00;
LAB_0017348e:
            sVar39 = pVVar31->els_num;
            if (sVar39 == 0) {
              return;
            }
            if (pVVar31->varr != (MIR_reg_t *)0x0) {
              pVVar31->els_num = sVar39 - 1;
              MVar6 = pVVar31->varr[sVar39 - 1];
              pMVar30 = get_uptodate_def_insn(pgVar36,MVar6);
              if ((pMVar30 != (MIR_insn_t)0x0) &&
                 ((*(uint *)&pMVar30->field_0x18 & 0xfffffffc) == 0)) {
                pMStack_c0 = pMVar30 + 1;
                pMStack_f8 = (MIR_insn_t_conflict)0x0;
                sVar39 = 0;
                pMVar34 = pMStack_c8;
                pMStack_e0 = pMVar29;
                uStack_d8 = uVar26;
                pgStack_b8 = pgVar36;
                do {
                  pMVar35 = pMVar40;
                  MIR_insn_op_mode((MIR_context_t)pgStack_d0,pMVar40,sVar39,&iStack_114);
                  if (((iStack_114 == 0) && ((char)pMVar34[-7] == '\x02')) &&
                     (*(MIR_reg_t *)(pMVar34 + -5) == MVar6)) {
                    auVar3 = *(undefined1 (*) [32])pMStack_c0;
                    *(MIR_mem_t *)(pMVar34 + -5) = *(MIR_mem_t *)&(pMStack_c0->insn_link).next;
                    *(undefined1 (*) [32])(pMVar34 + -9) = auVar3;
                    pMStack_f8 = (MIR_insn_t_conflict)&DAT_00000001;
                    bVar17 = false;
                  }
                  else {
                    bVar17 = true;
                    if (((char)pMVar34[-7] == '\v') &&
                       ((pMVar34[-1] == MVar6 || (*pMVar34 == MVar6)))) goto LAB_00173941;
                  }
                  if (!bVar17) {
                    pVVar9 = pgVar36->combine_ctx->changed_op_numbers;
                    gen_ctx_00 = (gen_ctx_t)pVVar9->varr;
                    if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_00173978;
                    uVar26 = pVVar9->els_num + 1;
                    if (pVVar9->size < uVar26) {
                      sVar38 = (uVar26 >> 1) + uVar26;
                      psVar27 = (size_t *)realloc(gen_ctx_00,sVar38 * 8);
                      pVVar9->varr = psVar27;
                      pVVar9->size = sVar38;
                      pgVar36 = pgStack_b8;
                    }
                    sVar38 = pVVar9->els_num;
                    pVVar9->els_num = sVar38 + 1;
                    pVVar9->varr[sVar38] = sVar39;
                    pMVar40 = uStack_100;
                  }
                  sVar39 = sVar39 + 1;
                  pMVar34 = pMVar34 + 0xc;
                } while (uStack_108 != sVar39);
                pMVar29 = pMStack_e0;
                uVar26 = uStack_d8;
                if ((int)pMStack_f8 != 0) {
                  pMVar35 = pMVar40;
                  gen_ctx_00 = pgVar36;
                  iVar25 = find_insn_pattern(pgVar36,pMVar40,(int *)0x0);
                  pMVar29 = pMStack_e0;
                  uVar26 = uStack_d8 & 0xffffffff;
                  if (-1 < iVar25) {
                    uVar26 = 1;
                  }
                  pcVar10 = pgVar36->combine_ctx;
                  pVVar9 = pcVar10->changed_op_numbers;
                  do {
                    if (pVVar9 == (VARR_size_t *)0x0) {
LAB_00173968:
                      combine_substitute_cold_6();
LAB_00173970:
                      combine_substitute_cold_5();
LAB_00173978:
                      combine_substitute_cold_2();
                      goto LAB_00173980;
                    }
                    pMVar35 = (MIR_insn_t_conflict)pVVar9->els_num;
                    if (pMVar35 == (MIR_insn_t_conflict)0x0) goto LAB_00173710;
                    gen_ctx_00 = (gen_ctx_t)pVVar9->varr;
                    if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_00173970;
                    pVVar9->els_num = (size_t)((long)&pMVar35[-1].ops[0].u + 0x1f);
                    pVVar13 = gen_ctx_00->call_used_hard_regs
                              [(long)&pMVar35[-1].ops[0].u.reg + 0x12];
                    if (iVar25 < 0) {
                      pMVar35 = (MIR_insn_t_conflict)pcVar10->last_right_ops;
                      if (((pMVar35 == (MIR_insn_t_conflict)0x0) ||
                          (pMVar15 = (pMVar35->insn_link).next, pMVar15 == (MIR_insn_t)0x0)) ||
                         ((bitmap_t)pMVar35->data <= pVVar13)) {
                        combine_substitute_cold_4();
                        goto LAB_00173968;
                      }
                      paVar2 = (anon_union_32_12_57d33f68_for_u *)(pMStack_e0 + (long)pVVar13);
                      aVar4 = pMVar15->ops[(long)((long)&pVVar13[-1].varr + 7)].u;
                      gen_ctx_00 = (gen_ctx_t)pMVar15->ops[(long)pVVar13].data;
                      paVar2[1].i = (int64_t)gen_ctx_00;
                      *(undefined8 *)((long)paVar2 + 0x28) =
                           *(undefined8 *)&pMVar15->ops[(long)pVVar13].field_0x8;
                      *paVar2 = aVar4;
                    }
                    else {
                      pVVar12 = pcVar10->last_right_ops;
                      if (((pVVar12 == (VARR_MIR_op_t *)0x0) ||
                          (pMVar14 = pVVar12->varr, pMVar14 == (MIR_op_t *)0x0)) ||
                         ((bitmap_t)pVVar12->els_num <= pVVar13)) goto LAB_00173939;
                      auVar3 = *(undefined1 (*) [32])(pMStack_e0 + (long)pVVar13);
                      *(undefined1 (*) [16])((long)&pMVar14[(long)pVVar13].u + 0x10) =
                           *(undefined1 (*) [16])((long)&pMStack_e0[(long)pVVar13].u + 0x10);
                      *(undefined1 (*) [32])(pMVar14 + (long)pVVar13) = auVar3;
                    }
                    pMVar35 = (MIR_insn_t_conflict)(pMStack_e0 + (long)pVVar13);
                    pcVar10 = pgVar36->combine_ctx;
                    pVVar9 = pcVar10->changed_op_numbers;
                  } while( true );
                }
              }
              goto LAB_001734d0;
            }
            goto LAB_00173931;
          }
          if (pVVar31->varr != (MIR_reg_t *)0x0) {
            MVar6 = *(MIR_reg_t *)&pMVar40[1].insn_link.next;
            if (pVVar31->varr[pVVar31->els_num - 1] == MVar6) {
              pMVar30 = get_uptodate_def_insn(gen_ctx_00,MVar6);
              if ((pMVar30 != (MIR_insn_t)0x0) &&
                 (uVar7 = *(uint *)&pMVar30->field_0x18, uVar7 - 0xaa < 0xfffffffd)) {
                target_get_early_clobbered_hard_regs(pMVar30,&MStack_ec,&MStack_f0);
                pMVar35 = uStack_100;
                pMVar40 = uStack_100;
                if ((((uVar7 < 4) ||
                     (((MStack_ec != 0xffffffff || (MStack_f0 != 0xffffffff)) ||
                      (*(char *)&uStack_100[1].insn_link.prev != '\x02')))) ||
                    (*(MIR_reg_t *)&uStack_100[1].insn_link.next != MVar6)) ||
                   ((uStack_100->ops[0].field_0x8 == '\v' &&
                    ((uStack_100->ops[0].u.mem.base == MVar6 ||
                     (uStack_100->ops[0].u.mem.index == MVar6)))))) goto LAB_00173458;
                pMVar29 = uStack_100->ops;
                pvStack_b0 = pMVar30->ops[0].data;
                uStack_a8 = *(undefined8 *)&pMVar30->ops[0].field_0x8;
                iStack_a0 = pMVar30->ops[0].u.i;
                pcStack_98 = pMVar30->ops[0].u.str.s;
                uStack_90 = *(undefined8 *)((long)&pMVar30->ops[0].u + 0x10);
                MStack_88 = pMVar30->ops[0].u.mem.disp;
                pvVar18 = pMVar29->data;
                uVar19 = *(undefined8 *)&uStack_100->ops[0].field_0x8;
                iVar20 = uStack_100->ops[0].u.i;
                pcVar21 = uStack_100->ops[0].u.str.s;
                pcVar22 = uStack_100->ops[0].u.str.s;
                uVar23 = *(undefined8 *)((long)&uStack_100->ops[0].u + 0x10);
                MVar24 = uStack_100->ops[0].u.mem.disp;
                pMVar30->ops[0].u.i = uStack_100->ops[0].u.i;
                pMVar30->ops[0].u.str.s = pcVar22;
                *(undefined8 *)((long)&pMVar30->ops[0].u + 0x10) = uVar23;
                pMVar30->ops[0].u.mem.disp = MVar24;
                pMVar30->ops[0].data = pvVar18;
                *(undefined8 *)&pMVar30->ops[0].field_0x8 = uVar19;
                pMVar30->ops[0].u.i = iVar20;
                pMVar30->ops[0].u.str.s = pcVar21;
                iVar25 = find_insn_pattern(gen_ctx_00,pMVar30,(int *)0x0);
                pMVar40 = pMStack_f8;
                pMVar15 = uStack_100;
                pMVar30->ops[0].data = pvStack_b0;
                *(undefined8 *)&pMVar30->ops[0].field_0x8 = uStack_a8;
                pMVar30->ops[0].u.i = iStack_a0;
                pMVar30->ops[0].u.str.s = pcStack_98;
                pMVar30->ops[0].u.i = iStack_a0;
                pMVar30->ops[0].u.str.s = pcStack_98;
                *(undefined8 *)((long)&pMVar30->ops[0].u + 0x10) = uStack_90;
                pMVar30->ops[0].u.mem.disp = MStack_88;
                if (-1 < iVar25) {
                  gen_move_insn_before(gen_ctx_00,uStack_100,pMVar30);
                  if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) &&
                     (1 < gen_ctx_00->debug_level)) {
                    fwrite("      moving insn ",0x12,1,(FILE *)gen_ctx_00->debug_file);
                    print_bb_insn(gen_ctx_00,(bb_insn_t_conflict)pMVar30->data,0);
                    fwrite("      before insn ",0x12,1,(FILE *)gen_ctx_00->debug_file);
                    print_bb_insn(gen_ctx_00,pbStack_110,1);
                  }
                  pvVar18 = pMVar29->data;
                  uVar19 = *(undefined8 *)&pMVar35->ops[0].field_0x8;
                  iVar20 = pMVar35->ops[0].u.i;
                  pcVar21 = pMVar35->ops[0].u.str.s;
                  pcVar22 = pMVar35->ops[0].u.str.s;
                  uVar23 = *(undefined8 *)((long)&pMVar35->ops[0].u + 0x10);
                  MVar24 = pMVar35->ops[0].u.mem.disp;
                  pMVar30->ops[0].u.i = pMVar35->ops[0].u.i;
                  pMVar30->ops[0].u.str.s = pcVar22;
                  *(undefined8 *)((long)&pMVar30->ops[0].u + 0x10) = uVar23;
                  pMVar30->ops[0].u.mem.disp = MVar24;
                  pMVar30->ops[0].data = pvVar18;
                  *(undefined8 *)&pMVar30->ops[0].field_0x8 = uVar19;
                  pMVar30->ops[0].u.i = iVar20;
                  pMVar30->ops[0].u.str.s = pcVar21;
                  if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) &&
                     (1 < gen_ctx_00->debug_level)) {
                    fwrite("      changing it to ",0x15,1,(FILE *)gen_ctx_00->debug_file);
                    print_bb_insn(gen_ctx_00,(bb_insn_t_conflict)pMVar30->data,1);
                    fwrite("      deleting insn ",0x14,1,(FILE *)gen_ctx_00->debug_file);
                    print_bb_insn(gen_ctx_00,pbStack_110,1);
                  }
                  gen_delete_insn(gen_ctx_00,pMVar15);
                  *plStack_e8 = *plStack_e8 + 1;
                  pMVar40->data = pMVar30->data;
                }
              }
              return;
            }
            goto LAB_00173458;
          }
          goto LAB_0017399a;
        }
      }
      combine_substitute_cold_9();
LAB_0017399a:
      combine_substitute_cold_1();
      if ((int)__size != -1) {
        pcVar10 = pgVar36->combine_ctx;
        if (pcVar10->var_ref_ages == (VARR_size_t *)0x0) {
          safe_var_substitution_p_cold_1();
          if (cStack_118 == '\v') {
            if ((((MIR_reg_t)uStack_100 == 0xffffffff) ||
                (iVar25 = obsolete_var_p(pgVar36,(MIR_reg_t)uStack_100,(size_t)__size), iVar25 == 0)
                ) && (uStack_100._4_4_ != 0xffffffff)) {
              obsolete_var_p(pgVar36,uStack_100._4_4_,(size_t)__size);
            }
          }
          else if (cStack_118 == '\x02') {
            obsolete_var_p(pgVar36,(MIR_reg_t)pbStack_110,(size_t)__size);
          }
          return;
        }
        uVar26 = (ulong)__size & 0xffffffff;
        if (((uVar26 < pcVar10->var_ref_ages->els_num) &&
            (pcVar10->var_ref_ages_addr[uVar26] == pcVar10->curr_bb_var_ref_age)) &&
           (pcVar10->var_refs_addr[uVar26].def_p != '\0')) {
          for (piVar32 = *(int **)(extraout_RDX_00 + 0x38);
              (piVar32 != (int *)0x0 && (*piVar32 != (int)__size)); piVar32 = *(int **)(piVar32 + 4)
              ) {
          }
        }
      }
      return;
    }
  }
  pcStack_50 = (code *)0x17314a;
  setup_var_ref_cold_5();
LAB_0017314a:
  pcStack_50 = (code *)0x173169;
  __assert_fail("(VARR_var_ref_tlength (gen_ctx->combine_ctx->var_refs)) == (VARR_size_tlength (gen_ctx->combine_ctx->var_ref_ages))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x22dc,"void setup_var_ref(gen_ctx_t, MIR_reg_t, MIR_insn_t, size_t, size_t, int)")
  ;
LAB_00173710:
  if (-1 < iVar25) {
    iVar25 = combine_delete_insn(pgVar36,pMVar30,pbStack_110);
    if (iVar25 != 0) {
      *plStack_e8 = *plStack_e8 + 1;
    }
    if (((FILE *)pgVar36->debug_file != (FILE *)0x0) && (1 < pgVar36->debug_level)) {
      fwrite("      changing to ",0x12,1,(FILE *)pgVar36->debug_file);
      print_bb_insn(pgVar36,pbStack_110,1);
    }
  }
LAB_001734d0:
  pVVar31 = pgVar36->combine_ctx->insn_vars;
  if (pVVar31 == (VARR_MIR_reg_t *)0x0) goto LAB_00173929;
  goto LAB_0017348e;
}

Assistant:

static void setup_var_ref (gen_ctx_t gen_ctx, MIR_reg_t var, MIR_insn_t insn, size_t nop,
                           size_t insn_num, int def_p) {
  static const var_ref_t var_ref = {NULL, 0, 0, FALSE, FALSE};

  if (var == MIR_NON_VAR) return;
  gen_assert (VARR_LENGTH (var_ref_t, var_refs) == VARR_LENGTH (size_t, var_ref_ages));
  if (VARR_LENGTH (var_ref_t, var_refs) <= var) {
    do {
      VARR_PUSH (size_t, var_ref_ages, 0);
      VARR_PUSH (var_ref_t, var_refs, var_ref);
    } while (VARR_LENGTH (var_ref_t, var_refs) <= var);
    var_refs_addr = VARR_ADDR (var_ref_t, var_refs);
    var_ref_ages_addr = VARR_ADDR (size_t, var_ref_ages);
  }
  var_ref_ages_addr[var] = curr_bb_var_ref_age;
  var_refs_addr[var].insn = insn;
  var_refs_addr[var].nop = nop;
  var_refs_addr[var].insn_num = insn_num;
  var_refs_addr[var].def_p = def_p;
  var_refs_addr[var].del_p = FALSE;
}